

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

bool __thiscall
CppJieba::MPSegment::cut
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *segWordInfos)

{
  bool bVar1;
  bool bVar2;
  allocator local_49;
  string local_48;
  SegmentContext segContext;
  
  if ((this->super_SegmentBase)._isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                  ,0x74,
                  "bool CppJieba::MPSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<TrieNodeInfo> &) const"
                 );
  }
  segContext.super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  segContext.super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  segContext.super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = _calcDAG(this,begin,end,&segContext);
  if (bVar1) {
    bVar1 = _calcDP(this,&segContext);
    if (bVar1) {
      bVar1 = _cut(this,&segContext,segWordInfos);
      bVar2 = true;
      if (bVar1) goto LAB_00111c6c;
      std::__cxx11::string::string((string *)&local_48,"_cut failed.",&local_49);
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x86,&local_48);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,"_calcDP failed.",&local_49);
      Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x80,&local_48);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_48,"_calcDAG failed.",&local_49);
    Limonp::Logger::LoggingF(3,"MPSegment.hpp",0x7a,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = false;
LAB_00111c6c:
  std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::~vector(&segContext);
  return bVar2;
}

Assistant:

bool cut(Unicode::const_iterator begin , Unicode::const_iterator end, vector<TrieNodeInfo>& segWordInfos)const
            {
				assert(_getInitFlag());
                SegmentContext segContext;

                //calc DAG
                if(!_calcDAG(begin, end, segContext))
                {
                    LogError("_calcDAG failed.");
                    return false;
                }

                if(!_calcDP(segContext))
                {
                    LogError("_calcDP failed.");
                    return false;
                }

                if(!_cut(segContext, segWordInfos))
                {
                    LogError("_cut failed.");
                    return false;
                }

                return true;
            }